

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEdit::paintEvent(QPlainTextEdit *this,QPaintEvent *e)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  Int IVar11;
  TextInteractionFlag TVar12;
  QWidget *pQVar13;
  QRect *pQVar14;
  long *plVar15;
  double *pdVar16;
  QColor *pQVar17;
  ulong uVar18;
  qreal *pqVar19;
  qsizetype qVar20;
  const_reference pSVar21;
  undefined8 extraout_RDX;
  QPaintEvent *in_RSI;
  long in_FS_OFFSET;
  qreal qVar22;
  double dVar23;
  int cpos;
  bool drawCursorAsBlock;
  bool drawCursor;
  int selEnd;
  int selStart;
  Selection *range;
  int i;
  int bllen;
  int blpos;
  QTextLayout *layout;
  int margin;
  bool editable;
  QPlainTextEditPrivate *d;
  QTextLine l;
  QList<QTextLayout::FormatRange> selections;
  QRectF contentsRect;
  QBrush bg;
  QRectF r;
  QRectF textRect;
  int maxX;
  qreal maximumWidth;
  QRect viewportRect;
  QRect er;
  QPointF offset;
  QPainter painter;
  FormatRange o_2;
  FormatRange o_1;
  FormatRange o;
  QTextBlockFormat blockFormat;
  PaintContext context;
  QColor col;
  QTextBlock block;
  undefined4 in_stack_fffffffffffffc28;
  TextInteractionFlag in_stack_fffffffffffffc2c;
  PaintContext *in_stack_fffffffffffffc30;
  QPlainTextEditPrivate *in_stack_fffffffffffffc38;
  QRectF *in_stack_fffffffffffffc40;
  QWidget *in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc54;
  byte in_stack_fffffffffffffc55;
  byte in_stack_fffffffffffffc56;
  byte in_stack_fffffffffffffc57;
  QWidget *in_stack_fffffffffffffc58;
  QRectF *in_stack_fffffffffffffc60;
  QRect *in_stack_fffffffffffffc68;
  bool local_38a;
  QPaintDevice *local_330;
  int local_328;
  bool local_322;
  int local_30c;
  QBrush local_2c8 [72];
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_280;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_27c;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  QRectF local_250;
  QBrush local_230 [8];
  qreal local_228;
  QRectF local_220;
  undefined4 local_1fc;
  undefined1 *local_1f8 [5];
  QRectF local_1d0;
  undefined1 local_1b0 [24];
  QRect local_198;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  int local_164;
  double local_160;
  int local_154;
  QSizeF local_150;
  qreal local_140;
  undefined1 local_138 [16];
  undefined1 *local_128;
  undefined1 *local_120;
  QPointF local_118;
  undefined1 *local_108;
  QTextBlock local_100;
  undefined8 local_f0;
  QRectF local_e8;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  QTextBlock local_98;
  int local_88 [14];
  QList<QAbstractTextDocumentLayout::Selection> QStack_50;
  QPalette local_38;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QPlainTextEdit *)0x6c5791);
  local_108 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar13 = QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffc30);
  local_330 = (QPaintDevice *)0x0;
  if (pQVar13 != (QWidget *)0x0) {
    local_330 = &pQVar13->super_QPaintDevice;
  }
  QPainter::QPainter((QPainter *)&local_108,local_330);
  local_118.yp = -NAN;
  local_118.xp = -NAN;
  local_118 = contentOffset((QPlainTextEdit *)in_stack_fffffffffffffc48);
  qVar22 = local_118.yp;
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  local_120 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar14 = QPaintEvent::rect(in_RSI);
  local_128 = *(undefined1 **)pQVar14;
  local_120._0_4_ = pQVar14->x2;
  local_120._4_4_ = pQVar14->y2;
  local_138._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_138._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffc30);
  local_138 = (undefined1  [16])QWidget::rect(in_stack_fffffffffffffc48);
  bVar3 = isReadOnly((QPlainTextEdit *)in_stack_fffffffffffffc30);
  bVar4 = (bVar3 ^ 0xffU) & 1;
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  firstVisibleBlock((QPlainTextEdit *)in_stack_fffffffffffffc38);
  document((QPlainTextEdit *)in_stack_fffffffffffffc30);
  plVar15 = (long *)QTextDocument::documentLayout();
  local_150.wd = (qreal)(**(code **)(*plVar15 + 0x78))();
  local_150.ht = qVar22;
  local_140 = QSizeF::width(&local_150);
  QPainter::setBrushOrigin((QPointF *)&local_108);
  qVar22 = QPointF::x(&local_118);
  iVar5 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  local_160 = (double)iVar5;
  pdVar16 = qMax<double>(&local_160,&local_140);
  dVar1 = *pdVar16;
  document((QPlainTextEdit *)in_stack_fffffffffffffc30);
  dVar23 = (double)QTextDocument::documentMargin();
  iVar5 = cursorWidth((QPlainTextEdit *)in_stack_fffffffffffffc30);
  local_154 = (int)(((qVar22 + dVar1) - dVar23) + (double)iVar5);
  local_164 = QRect::right((QRect *)0x6c5a20);
  qMin<int>(&local_164,&local_154);
  QRect::setRight((QRect *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
  QPainter::setClipRect((QRect *)&local_108,(ClipOperation)&local_128);
  bVar3 = QPlainTextEditPrivate::placeHolderTextToBeShown(in_stack_fffffffffffffc38);
  local_328 = in_stack_fffffffffffffc50;
  if (bVar3) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QWidgetTextControl::palette((QWidgetTextControl *)in_stack_fffffffffffffc38);
    QPalette::placeholderText((QPalette *)0x6c5ac2);
    pQVar17 = QBrush::color((QBrush *)0x6c5aca);
    local_28 = *(undefined1 **)pQVar17;
    local_20 = *(undefined1 **)((long)&pQVar17->ct + 4);
    QPalette::~QPalette(&local_38);
    QPainter::setPen((QColor *)&local_108);
    pQVar14 = QPaintEvent::rect(in_RSI);
    QPainter::setClipRect((QRect *)&local_108,(ClipOperation)pQVar14);
    document((QPlainTextEdit *)in_stack_fffffffffffffc30);
    QTextDocument::documentMargin();
    local_188 = 0xffffffffffffffff;
    local_180 = 0xffffffffffffffff;
    local_178 = 0xffffffffffffffff;
    local_170 = 0xffffffffffffffff;
    local_198 = QRect::adjusted(in_stack_fffffffffffffc68,
                                (int)((ulong)in_stack_fffffffffffffc60 >> 0x20),
                                (int)in_stack_fffffffffffffc60,
                                (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                                (int)in_stack_fffffffffffffc58);
    QRectF::QRectF(in_stack_fffffffffffffc40,(QRect *)in_stack_fffffffffffffc38);
    uVar6 = Qt::operator|((AlignmentFlag)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                          (TextFlag)in_stack_fffffffffffffc30);
    placeholderText((QPlainTextEdit *)in_stack_fffffffffffffc38);
    QPainter::drawText((QRectF *)&local_108,(int)&local_188,(QString *)(ulong)uVar6,
                       (QRectF *)local_1b0);
    QString::~QString((QString *)0x6c5c22);
    local_328 = in_stack_fffffffffffffc50;
  }
  memcpy(local_88,&DAT_00b259c8,0x50);
  getPaintContext((QPlainTextEdit *)in_stack_fffffffffffffc38);
  QPalette::text((QPalette *)0x6c5c61);
  QBrush::color((QBrush *)0x6c5c69);
  QPainter::setPen((QColor *)&local_108);
  while (uVar18 = QTextBlock::isValid(), (uVar18 & 1) != 0) {
    local_1d0.xp = -NAN;
    local_1d0.yp = -NAN;
    local_1d0.w = -NAN;
    local_1d0.h = -NAN;
    blockBoundingRect((QPlainTextEdit *)in_stack_fffffffffffffc40,
                      (QTextBlock *)in_stack_fffffffffffffc38);
    QRectF::translated(in_stack_fffffffffffffc60,(QPointF *)in_stack_fffffffffffffc58);
    pQVar13 = (QWidget *)QTextBlock::layout();
    uVar18 = QTextBlock::isVisible();
    if ((uVar18 & 1) == 0) {
      qVar22 = QRectF::height(&local_1d0);
      pqVar19 = QPointF::ry(&local_118);
      *pqVar19 = qVar22 + *pqVar19;
      QTextBlock::next();
      QTextBlock::operator=((QTextBlock *)local_18,&local_98);
    }
    else {
      qVar22 = QRectF::bottom(&local_1d0);
      iVar5 = QRect::top((QRect *)0x6c5da8);
      if ((double)iVar5 <= qVar22) {
        qVar22 = QRectF::top(&local_1d0);
        iVar5 = QRect::bottom((QRect *)0x6c5ddc);
        if (qVar22 <= (double)iVar5) {
          local_a8 = &DAT_aaaaaaaaaaaaaaaa;
          local_a0 = &DAT_aaaaaaaaaaaaaaaa;
          QTextBlock::blockFormat();
          local_1f8[0] = &DAT_aaaaaaaaaaaaaaaa;
          QTextFormat::background
                    ((QTextFormat *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
          local_1fc = 0;
          bVar3 = ::operator!=((QBrush *)in_stack_fffffffffffffc30,
                               (BrushStyle *)
                               CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
          if (bVar3) {
            local_220.xp = local_1d0.xp;
            local_220.yp = local_1d0.yp;
            local_220.w = local_1d0.w;
            local_220.h = local_1d0.h;
            local_228 = QRectF::width(&local_1d0);
            pdVar16 = qMax<double>(&local_228,&local_140);
            QRectF::setWidth(&local_220,*pdVar16);
            QBrush::QBrush(local_230,(QBrush *)local_1f8);
            QRectF::QRectF(&local_250);
            fillBackground((QPainter *)in_stack_fffffffffffffc58,
                           (QRectF *)
                           CONCAT17(in_stack_fffffffffffffc57,
                                    CONCAT16(in_stack_fffffffffffffc56,
                                             CONCAT15(in_stack_fffffffffffffc55,
                                                      CONCAT14(in_stack_fffffffffffffc54,local_328))
                                            )),(QBrush *)in_stack_fffffffffffffc48,
                           in_stack_fffffffffffffc40);
            QBrush::~QBrush(local_230);
          }
          local_268 = &DAT_aaaaaaaaaaaaaaaa;
          local_260 = &DAT_aaaaaaaaaaaaaaaa;
          local_258 = &DAT_aaaaaaaaaaaaaaaa;
          QList<QTextLayout::FormatRange>::QList((QList<QTextLayout::FormatRange> *)0x6c5fb6);
          iVar5 = QTextBlock::position();
          iVar7 = QTextBlock::length();
          for (local_30c = 0;
              qVar20 = QList<QAbstractTextDocumentLayout::Selection>::size(&QStack_50),
              local_30c < qVar20; local_30c = local_30c + 1) {
            pSVar21 = QList<QAbstractTextDocumentLayout::Selection>::at
                                ((QList<QAbstractTextDocumentLayout::Selection> *)
                                 in_stack_fffffffffffffc30,
                                 CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
            iVar8 = QTextCursor::selectionStart();
            iVar8 = iVar8 - iVar5;
            iVar9 = QTextCursor::selectionEnd();
            iVar9 = iVar9 - iVar5;
            if (((iVar8 < iVar7) && (0 < iVar9)) && (iVar8 < iVar9)) {
              local_c0 = &DAT_aaaaaaaaaaaaaaaa;
              local_b8 = &DAT_aaaaaaaaaaaaaaaa;
              local_b0 = &DAT_aaaaaaaaaaaaaaaa;
              QTextLayout::FormatRange::FormatRange((FormatRange *)0x6c60f1);
              local_c0 = (undefined1 *)CONCAT44(iVar9 - iVar8,iVar8);
              QTextCharFormat::operator=
                        ((QTextCharFormat *)in_stack_fffffffffffffc30,
                         (QTextCharFormat *)
                         CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
              QList<QTextLayout::FormatRange>::append
                        ((QList<QTextLayout::FormatRange> *)in_stack_fffffffffffffc30,
                         (parameter_type)
                         CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
              QTextLayout::FormatRange::~FormatRange((FormatRange *)0x6c6153);
            }
            else {
              uVar18 = QTextCursor::hasSelection();
              if (((uVar18 & 1) == 0) &&
                 (uVar18 = QTextFormat::hasProperty((int)pSVar21 + 8), (uVar18 & 1) != 0)) {
                QTextCursor::position();
                uVar18 = QTextBlock::contains((int)local_18);
                if ((uVar18 & 1) != 0) {
                  local_e8.w = (qreal)&DAT_aaaaaaaaaaaaaaaa;
                  local_e8.h = (qreal)&DAT_aaaaaaaaaaaaaaaa;
                  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
                  QTextLayout::FormatRange::FormatRange((FormatRange *)0x6c61eb);
                  local_278 = &DAT_aaaaaaaaaaaaaaaa;
                  local_270 = &DAT_aaaaaaaaaaaaaaaa;
                  QTextCursor::position();
                  uVar10 = QTextLayout::lineForTextPosition((int)pQVar13);
                  local_278 = (undefined1 *)CONCAT44(local_278._4_4_,uVar10);
                  local_270 = (undefined1 *)extraout_RDX;
                  uVar10 = QTextLine::textStart();
                  local_e8.w = (qreal)CONCAT44(local_e8.w._4_4_,uVar10);
                  iVar8 = QTextLine::textLength();
                  if (local_e8.w._0_4_ + iVar8 == iVar7 + -1) {
                    iVar8 = iVar8 + 1;
                  }
                  local_e8.w = (qreal)CONCAT44(iVar8,local_e8.w._0_4_);
                  QTextCharFormat::operator=
                            ((QTextCharFormat *)in_stack_fffffffffffffc30,
                             (QTextCharFormat *)
                             CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
                  QList<QTextLayout::FormatRange>::append
                            ((QList<QTextLayout::FormatRange> *)in_stack_fffffffffffffc30,
                             (parameter_type)
                             CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
                  QTextLayout::FormatRange::~FormatRange((FormatRange *)0x6c62d9);
                }
              }
            }
          }
          if (bVar4 == 0) {
            local_280.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
                 (QFlagsStorage<Qt::TextInteractionFlag>)
                 textInteractionFlags
                           ((QPlainTextEdit *)
                            CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
            local_27c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
                 (QFlagsStorage<Qt::TextInteractionFlag>)
                 QFlags<Qt::TextInteractionFlag>::operator&
                           ((QFlags<Qt::TextInteractionFlag> *)in_stack_fffffffffffffc30,
                            in_stack_fffffffffffffc2c);
            IVar11 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_27c);
            bVar3 = false;
            if (IVar11 != 0) goto LAB_006c6344;
          }
          else {
LAB_006c6344:
            bVar3 = false;
            if (iVar5 <= local_88[0]) {
              bVar3 = local_88[0] < iVar5 + iVar7;
            }
          }
          local_38a = false;
          if (bVar3) {
            local_38a = overwriteMode((QPlainTextEdit *)in_stack_fffffffffffffc30);
          }
          local_322 = local_38a;
          if (local_38a != false) {
            if (local_88[0] == iVar5 + iVar7 + -1) {
              local_322 = false;
            }
            else {
              local_f0 = &DAT_aaaaaaaaaaaaaaaa;
              local_e8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
              local_e8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
              QTextLayout::FormatRange::FormatRange((FormatRange *)0x6c6424);
              local_f0 = (undefined1 *)CONCAT44(1,local_88[0] - iVar5);
              in_stack_fffffffffffffc60 = &local_e8;
              QWidget::palette((QWidget *)in_stack_fffffffffffffc30);
              QPalette::base((QPalette *)0x6c646a);
              QTextFormat::setForeground
                        ((QTextFormat *)in_stack_fffffffffffffc38,
                         (QBrush *)in_stack_fffffffffffffc30);
              QWidget::palette((QWidget *)in_stack_fffffffffffffc30);
              QPalette::text((QPalette *)0x6c649d);
              QTextFormat::setBackground
                        ((QTextFormat *)in_stack_fffffffffffffc38,
                         (QBrush *)in_stack_fffffffffffffc30);
              QList<QTextLayout::FormatRange>::append
                        ((QList<QTextLayout::FormatRange> *)in_stack_fffffffffffffc30,
                         (parameter_type)
                         CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
              QTextLayout::FormatRange::~FormatRange((FormatRange *)0x6c64cc);
            }
          }
          in_stack_fffffffffffffc58 = pQVar13;
          QRectF::QRectF(in_stack_fffffffffffffc40,(QRect *)in_stack_fffffffffffffc38);
          QTextLayout::draw((QPainter *)in_stack_fffffffffffffc58,(QPointF *)&local_108,
                            (QList_conflict2 *)&local_118,(QRectF *)&local_268);
          bVar2 = false;
          if ((((!bVar3) || (in_stack_fffffffffffffc55 = 1, local_322 != false)) &&
              (in_stack_fffffffffffffc56 = 0, in_stack_fffffffffffffc55 = in_stack_fffffffffffffc56,
              bVar4 != 0)) &&
             (in_stack_fffffffffffffc56 = 0, in_stack_fffffffffffffc55 = in_stack_fffffffffffffc56,
             local_88[0] < -1)) {
            QTextLayout::preeditAreaText();
            bVar2 = true;
            bVar3 = QString::isEmpty((QString *)0x6c6587);
            in_stack_fffffffffffffc56 = bVar3 ^ 0xff;
            in_stack_fffffffffffffc55 = in_stack_fffffffffffffc56;
          }
          in_stack_fffffffffffffc57 = in_stack_fffffffffffffc55;
          if (bVar2) {
            QString::~QString((QString *)0x6c65b6);
          }
          iVar7 = local_88[0];
          if ((in_stack_fffffffffffffc55 & 1) != 0) {
            if (local_88[0] < -1) {
              local_328 = QTextLayout::preeditAreaPosition();
              local_328 = local_328 - (iVar7 + 2);
            }
            else {
              local_328 = local_88[0] - iVar5;
            }
            cursorWidth((QPlainTextEdit *)in_stack_fffffffffffffc30);
            QTextLayout::drawCursor
                      ((QPainter *)pQVar13,(QPointF *)&local_108,(int)&local_118,local_328);
            in_stack_fffffffffffffc48 = pQVar13;
          }
          QList<QTextLayout::FormatRange>::~QList((QList<QTextLayout::FormatRange> *)0x6c6667);
          QBrush::~QBrush((QBrush *)local_1f8);
          QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x6c6681);
        }
      }
      in_stack_fffffffffffffc38 = (QPlainTextEditPrivate *)QRectF::height(&local_1d0);
      pqVar19 = QPointF::ry(&local_118);
      *pqVar19 = (double)in_stack_fffffffffffffc38 + *pqVar19;
      in_stack_fffffffffffffc40 = (QRectF *)QPointF::y(&local_118);
      iVar5 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      if ((double)iVar5 < (double)in_stack_fffffffffffffc40) break;
      QTextBlock::next();
      QTextBlock::operator=((QTextBlock *)local_18,&local_100);
    }
  }
  bVar3 = backgroundVisible((QPlainTextEdit *)in_stack_fffffffffffffc30);
  if ((bVar3) && (uVar18 = QTextBlock::isValid(), (uVar18 & 1) == 0)) {
    in_stack_fffffffffffffc30 = (PaintContext *)QPointF::y(&local_118);
    iVar5 = QRect::bottom((QRect *)0x6c675b);
    if ((double)in_stack_fffffffffffffc30 <= (double)iVar5) {
      bVar3 = centerOnScroll((QPlainTextEdit *)in_stack_fffffffffffffc30);
      if (!bVar3) {
        QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffc30);
        in_stack_fffffffffffffc2c =
             QAbstractSlider::maximum((QAbstractSlider *)in_stack_fffffffffffffc30);
        QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffc30);
        TVar12 = QAbstractSlider::minimum((QAbstractSlider *)in_stack_fffffffffffffc30);
        if (in_stack_fffffffffffffc2c != TVar12) goto LAB_006c684c;
      }
      iVar5 = QRect::left((QRect *)0x6c67c9);
      QPointF::y(&local_118);
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,iVar5);
      QRect::bottomRight((QRect *)CONCAT44(in_stack_fffffffffffffc2c,iVar5));
      QRect::QRect((QRect *)CONCAT17(in_stack_fffffffffffffc57,
                                     CONCAT16(in_stack_fffffffffffffc56,
                                              CONCAT15(in_stack_fffffffffffffc55,
                                                       CONCAT14(in_stack_fffffffffffffc54,local_328)
                                                      ))),(QPoint *)in_stack_fffffffffffffc48,
                   (QPoint *)in_stack_fffffffffffffc40);
      QWidget::palette((QWidget *)in_stack_fffffffffffffc30);
      QPalette::window((QPalette *)0x6c6834);
      QPainter::fillRect((QRect *)&local_108,local_2c8);
    }
  }
LAB_006c684c:
  QAbstractTextDocumentLayout::PaintContext::~PaintContext(in_stack_fffffffffffffc30);
  QPainter::~QPainter((QPainter *)&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextEdit::paintEvent(QPaintEvent *e)
{
    Q_D(QPlainTextEdit);
    QPainter painter(viewport());
    Q_ASSERT(qobject_cast<QPlainTextDocumentLayout*>(document()->documentLayout()));

    QPointF offset(contentOffset());

    QRect er = e->rect();
    QRect viewportRect = viewport()->rect();

    bool editable = !isReadOnly();

    QTextBlock block = firstVisibleBlock();
    qreal maximumWidth = document()->documentLayout()->documentSize().width();

    // Set a brush origin so that the WaveUnderline knows where the wave started
    painter.setBrushOrigin(offset);

    // keep right margin clean from full-width selection
    int maxX = offset.x() + qMax((qreal)viewportRect.width(), maximumWidth)
               - document()->documentMargin() + cursorWidth();
    er.setRight(qMin(er.right(), maxX));
    painter.setClipRect(er);

    if (d->placeHolderTextToBeShown()) {
        const QColor col = d->control->palette().placeholderText().color();
        painter.setPen(col);
        painter.setClipRect(e->rect());
        const int margin = int(document()->documentMargin());
        QRectF textRect = viewportRect.adjusted(margin, margin, 0, 0);
        painter.drawText(textRect, Qt::AlignTop | Qt::TextWordWrap, placeholderText());
    }

    QAbstractTextDocumentLayout::PaintContext context = getPaintContext();
    painter.setPen(context.palette.text().color());

    while (block.isValid()) {

        QRectF r = blockBoundingRect(block).translated(offset);
        QTextLayout *layout = block.layout();

        if (!block.isVisible()) {
            offset.ry() += r.height();
            block = block.next();
            continue;
        }

        if (r.bottom() >= er.top() && r.top() <= er.bottom()) {

            QTextBlockFormat blockFormat = block.blockFormat();

            QBrush bg = blockFormat.background();
            if (bg != Qt::NoBrush) {
                QRectF contentsRect = r;
                contentsRect.setWidth(qMax(r.width(), maximumWidth));
                fillBackground(&painter, contentsRect, bg);
            }

            QList<QTextLayout::FormatRange> selections;
            int blpos = block.position();
            int bllen = block.length();
            for (int i = 0; i < context.selections.size(); ++i) {
                const QAbstractTextDocumentLayout::Selection &range = context.selections.at(i);
                const int selStart = range.cursor.selectionStart() - blpos;
                const int selEnd = range.cursor.selectionEnd() - blpos;
                if (selStart < bllen && selEnd > 0
                    && selEnd > selStart) {
                    QTextLayout::FormatRange o;
                    o.start = selStart;
                    o.length = selEnd - selStart;
                    o.format = range.format;
                    selections.append(o);
                } else if (!range.cursor.hasSelection() && range.format.hasProperty(QTextFormat::FullWidthSelection)
                           && block.contains(range.cursor.position())) {
                    // for full width selections we don't require an actual selection, just
                    // a position to specify the line. that's more convenience in usage.
                    QTextLayout::FormatRange o;
                    QTextLine l = layout->lineForTextPosition(range.cursor.position() - blpos);
                    o.start = l.textStart();
                    o.length = l.textLength();
                    if (o.start + o.length == bllen - 1)
                        ++o.length; // include newline
                    o.format = range.format;
                    selections.append(o);
                }
            }

            bool drawCursor = ((editable || (textInteractionFlags() & Qt::TextSelectableByKeyboard))
                               && context.cursorPosition >= blpos
                               && context.cursorPosition < blpos + bllen);

            bool drawCursorAsBlock = drawCursor && overwriteMode() ;

            if (drawCursorAsBlock) {
                if (context.cursorPosition == blpos + bllen - 1) {
                    drawCursorAsBlock = false;
                } else {
                    QTextLayout::FormatRange o;
                    o.start = context.cursorPosition - blpos;
                    o.length = 1;
                    o.format.setForeground(palette().base());
                    o.format.setBackground(palette().text());
                    selections.append(o);
                }
            }

            layout->draw(&painter, offset, selections, er);

            if ((drawCursor && !drawCursorAsBlock)
                || (editable && context.cursorPosition < -1
                    && !layout->preeditAreaText().isEmpty())) {
                int cpos = context.cursorPosition;
                if (cpos < -1)
                    cpos = layout->preeditAreaPosition() - (cpos + 2);
                else
                    cpos -= blpos;
                layout->drawCursor(&painter, offset, cpos, cursorWidth());
            }
        }

        offset.ry() += r.height();
        if (offset.y() > viewportRect.height())
            break;
        block = block.next();
    }

    if (backgroundVisible() && !block.isValid() && offset.y() <= er.bottom()
        && (centerOnScroll() || verticalScrollBar()->maximum() == verticalScrollBar()->minimum())) {
        painter.fillRect(QRect(QPoint((int)er.left(), (int)offset.y()), er.bottomRight()), palette().window());
    }
}